

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int share_forwarding_cmp(void *av,void *bv)

{
  int i;
  share_forwarding *b;
  share_forwarding *a;
  void *bv_local;
  void *av_local;
  
  av_local._4_4_ = strcmp(*av,*bv);
  if (av_local._4_4_ == 0) {
    if (*(int *)((long)av + 8) < *(int *)((long)bv + 8)) {
      av_local._4_4_ = -1;
    }
    else if (*(int *)((long)bv + 8) < *(int *)((long)av + 8)) {
      av_local._4_4_ = 1;
    }
    else {
      av_local._4_4_ = 0;
    }
  }
  return av_local._4_4_;
}

Assistant:

static int share_forwarding_cmp(void *av, void *bv)
{
    const struct share_forwarding *a = (const struct share_forwarding *)av;
    const struct share_forwarding *b = (const struct share_forwarding *)bv;
    int i;

    if ((i = strcmp(a->host, b->host)) != 0)
        return i;
    else if (a->port < b->port)
        return -1;
    else if (a->port > b->port)
        return +1;
    else
        return 0;
}